

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::ParsedScene::LightSource
          (ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  string ret;
  AnimatedTransform renderFromLight;
  ParameterDictionary local_810;
  ParameterDictionary local_7a8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_740;
  LightSceneEntity local_6e0;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  if (this->currentApiState == OptionsBlock) {
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p =
         (pointer)&local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2;
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_string_length = 0;
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[12]>
              ((string *)&local_6e0,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [12])0x5e408e);
    Error((FileLoc *)&params,
          local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_740,in_RDX);
      ParameterDictionary::ParameterDictionary
                (&local_7a8,&local_740,&this->graphicsState->lightAttributes,
                 this->graphicsState->colorSpace);
      local_740.nStored = 0;
      (*(local_740.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_740.alloc.memoryResource,local_740.ptr,local_740.nAlloc << 3,8);
      GetCTM((Transform *)&local_6e0,this,0);
      startTime = this->transformStartTime;
      GetCTM(&local_368,this,1);
      AnimatedTransform::AnimatedTransform
                (&local_2e8,(Transform *)&local_6e0,startTime,&local_368,this->transformEndTime);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::InlinedVector(&local_810.params,&local_7a8.params);
      local_810.colorSpace = local_7a8.colorSpace;
      loc_00.filename._M_str = (char *)params.ptr;
      loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
      loc_00._16_8_ = params.field_2.fixed[0];
      LightSceneEntity::LightSceneEntity
                (&local_6e0,name,&local_810,loc_00,&local_2e8,
                 &this->graphicsState->currentOutsideMedium);
      std::vector<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>::
      emplace_back<pbrt::LightSceneEntity>(&this->lights,&local_6e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0.medium._M_dataplus._M_p != &local_6e0.medium.field_2) {
        operator_delete(local_6e0.medium._M_dataplus._M_p,
                        local_6e0.medium.field_2._M_allocated_capacity + 1);
      }
      local_6e0.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nStored = 0;
      (*(local_6e0.super_TransformedSceneEntity.super_SceneEntity.parameters.params.alloc.
        memoryResource)->_vptr_memory_resource[3])
                (local_6e0.super_TransformedSceneEntity.super_SceneEntity.parameters.params.alloc.
                 memoryResource,
                 local_6e0.super_TransformedSceneEntity.super_SceneEntity.parameters.params.ptr,
                 local_6e0.super_TransformedSceneEntity.super_SceneEntity.parameters.params.nAlloc
                 << 3,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p !=
          &local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
        operator_delete(local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus.
                        _M_p,CONCAT71(local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.
                                      field_2._M_allocated_capacity._1_7_,
                                      local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.
                                      field_2._M_local_buf[0]) + 1);
      }
      local_810.params.nStored = 0;
      (*(local_810.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_810.params.alloc.memoryResource,local_810.params.ptr,
                 local_810.params.nAlloc << 3,8);
      local_7a8.params.nStored = 0;
      (*(local_7a8.params.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_7a8.params.alloc.memoryResource,local_7a8.params.ptr,
                 local_7a8.params.nAlloc << 3,8);
      return;
    }
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p =
         (pointer)&local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2;
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_string_length = 0;
    local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<char_const(&)[12]>
              ((string *)&local_6e0,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [12])0x5e408e);
    Error((FileLoc *)&params,
          local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p !=
      &local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2) {
    operator_delete(local_6e0.super_TransformedSceneEntity.super_SceneEntity.name._M_dataplus._M_p,
                    CONCAT71(local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2.
                             _M_allocated_capacity._1_7_,
                             local_6e0.super_TransformedSceneEntity.super_SceneEntity.name.field_2.
                             _M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ParsedScene::LightSource(const std::string &name, ParsedParameterVector params,
                              FileLoc loc) {
    VERIFY_WORLD("LightSource");
    ParameterDictionary dict(std::move(params), graphicsState->lightAttributes,
                             graphicsState->colorSpace);
    AnimatedTransform renderFromLight(GetCTM(0), transformStartTime, GetCTM(1),
                                      transformEndTime);

    lights.push_back(LightSceneEntity(name, std::move(dict), loc, renderFromLight,
                                      graphicsState->currentOutsideMedium));
}